

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondPersistence.cpp
# Opt level: O0

void __thiscall OpenMD::HBondPersistence::computeFrame(HBondPersistence *this,int istep)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  double dVar5;
  int index;
  int aInd;
  int hInd;
  int jj;
  int ii;
  RealType ctheta;
  RealType theta;
  RealType HAdist;
  RealType DHdist;
  RealType DAdist;
  Vector3d uDA;
  Vector3d HA;
  Vector3d DA;
  Vector3d DH;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d dPos;
  Atom *hba;
  iterator hbai;
  HBondDonor *hbd;
  iterator hbdi;
  Molecule *mol2;
  Molecule *mol1;
  SelectionManager *in_stack_fffffffffffffd38;
  value_type in_stack_fffffffffffffd40;
  value_type in_stack_fffffffffffffd44;
  StuntDouble *in_stack_fffffffffffffd48;
  SelectionManager *in_stack_fffffffffffffd50;
  pointer *in_stack_fffffffffffffd58;
  Molecule *in_stack_fffffffffffffd60;
  SelectionEvaluator *in_stack_fffffffffffffd78;
  Vector3d *in_stack_fffffffffffffdb8;
  Snapshot *in_stack_fffffffffffffdc0;
  undefined1 local_168 [64];
  undefined4 local_128;
  value_type local_124;
  int local_120;
  int local_11c;
  pointer local_110;
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  Atom *local_40;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_38;
  HBondDonor *local_30;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_28;
  Molecule *local_20;
  Molecule *local_18;
  int local_c;
  
  local_c = in_ESI;
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_38);
  Vector3<double>::Vector3((Vector3<double> *)0x16832a);
  Vector3<double>::Vector3((Vector3<double> *)0x168337);
  Vector3<double>::Vector3((Vector3<double> *)0x168344);
  Vector3<double>::Vector3((Vector3<double> *)0x168351);
  Vector3<double>::Vector3((Vector3<double> *)0x16835e);
  Vector3<double>::Vector3((Vector3<double> *)0x16836b);
  Vector3<double>::Vector3((Vector3<double> *)0x168378);
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)(in_RDI + 0x98),(long)local_c);
  SimInfo::getNGlobalAtoms
            ((SimInfo *)
             in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  local_128 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_RDI,(size_type)pvVar2,(value_type_conflict2 *)in_stack_fffffffffffffd60);
  if (((ulong)in_RDI[0x8d].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish & 1) == 0) {
    SelectionManager::operator=
              ((SelectionManager *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
  }
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1c));
  if (bVar1) {
    in_stack_fffffffffffffd58 =
         &in_RDI[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish;
    in_stack_fffffffffffffd60 = (Molecule *)(local_168 + 0x28);
    SelectionEvaluator::evaluate(in_stack_fffffffffffffd78);
    SelectionManager::setSelectionSet
              (in_stack_fffffffffffffd50,(SelectionSet *)in_stack_fffffffffffffd48);
    SelectionSet::~SelectionSet((SelectionSet *)0x168454);
  }
  if ((((ulong)in_RDI[0x8d].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish & 1) != 0) &&
     (bVar1 = SelectionEvaluator::isDynamic
                        ((SelectionEvaluator *)
                         &in_RDI[0x54].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), bVar1)) {
    in_stack_fffffffffffffd48 =
         (StuntDouble *)
         &in_RDI[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage;
    in_stack_fffffffffffffd50 = (SelectionManager *)local_168;
    SelectionEvaluator::evaluate(in_stack_fffffffffffffd78);
    SelectionManager::setSelectionSet
              (in_stack_fffffffffffffd50,(SelectionSet *)in_stack_fffffffffffffd48);
    SelectionSet::~SelectionSet((SelectionSet *)0x1684ef);
  }
  local_18 = SelectionManager::beginSelectedMolecule
                       (in_stack_fffffffffffffd50,(int *)in_stack_fffffffffffffd48);
  while (local_18 != (Molecule *)0x0) {
    local_20 = SelectionManager::beginSelectedMolecule
                         (in_stack_fffffffffffffd50,(int *)in_stack_fffffffffffffd48);
    while (local_20 != (Molecule *)0x0) {
      local_30 = Molecule::beginHBondDonor
                           (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
      while (local_30 != (HBondDonor *)0x0) {
        StuntDouble::getPos(in_stack_fffffffffffffd48);
        Vector3<double>::operator=
                  ((Vector3<double> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (Vector3<double> *)in_stack_fffffffffffffd38);
        StuntDouble::getPos(in_stack_fffffffffffffd48);
        Vector3<double>::operator=
                  ((Vector3<double> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (Vector3<double> *)in_stack_fffffffffffffd38);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd48,
                          (Vector<double,_3U> *)
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffd48,
                   (Vector<double,_3U> *)
                   CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        Snapshot::wrapVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        local_f8 = (pointer)Vector<double,_3U>::length((Vector<double,_3U> *)0x168656);
        local_11c = StuntDouble::getGlobalIndex(&local_30->donatedHydrogen->super_StuntDouble);
        local_120 = -1;
        local_40 = Molecule::beginHBondAcceptor
                             (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
        while (local_40 != (Atom *)0x0) {
          StuntDouble::getPos(in_stack_fffffffffffffd48);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (Vector3<double> *)in_stack_fffffffffffffd38);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd48,
                            (Vector<double,_3U> *)
                            CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffd48,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          Snapshot::wrapVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          local_f0 = (pointer)Vector<double,_3U>::length((Vector<double,_3U> *)0x168730);
          if ((double)local_f0 <
              (double)in_RDI[0x9b].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) {
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd48,
                              (Vector<double,_3U> *)
                              CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffffd48,
                       (Vector<double,_3U> *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            Snapshot::wrapVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            local_100 = (pointer)Vector<double,_3U>::length((Vector<double,_3U> *)0x1687b1);
            dVar5 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffd50,
                                   (Vector<double,_3U> *)in_stack_fffffffffffffd48);
            local_110 = (pointer)(dVar5 / ((double)local_f8 * (double)local_f0));
            dVar5 = acos((double)local_110);
            local_108 = (pointer)((dVar5 * 180.0) / 3.141592653589793);
            if (((double)local_108 <
                 (double)in_RDI[0x9b].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) &&
               ((double)local_100 <
                (double)in_RDI[0x9b].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)) {
              local_120 = StuntDouble::getGlobalIndex(&local_40->super_StuntDouble);
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)(in_RDI + 0x9a),(long)local_c);
              sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
              in_stack_fffffffffffffd44 = (value_type)sVar3;
              local_124 = in_stack_fffffffffffffd44;
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)(in_RDI + 0x98),(long)local_c);
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_11c);
              *pvVar4 = in_stack_fffffffffffffd44;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x9a),(long)local_c);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                         (value_type_conflict2 *)in_stack_fffffffffffffd48);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x99),(long)local_c);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                         (value_type_conflict2 *)in_stack_fffffffffffffd48);
            }
          }
          local_40 = Molecule::nextHBondAcceptor
                               (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
        }
        local_30 = Molecule::nextHBondDonor
                             (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
      }
      local_30 = Molecule::beginHBondDonor
                           (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
      while (local_30 != (HBondDonor *)0x0) {
        StuntDouble::getPos(in_stack_fffffffffffffd48);
        Vector3<double>::operator=
                  ((Vector3<double> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (Vector3<double> *)in_stack_fffffffffffffd38);
        StuntDouble::getPos(in_stack_fffffffffffffd48);
        Vector3<double>::operator=
                  ((Vector3<double> *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (Vector3<double> *)in_stack_fffffffffffffd38);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd48,
                          (Vector<double,_3U> *)
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffd48,
                   (Vector<double,_3U> *)
                   CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        Snapshot::wrapVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        local_f8 = (pointer)Vector<double,_3U>::length((Vector<double,_3U> *)0x168a4e);
        local_11c = StuntDouble::getGlobalIndex(&local_30->donatedHydrogen->super_StuntDouble);
        local_120 = -1;
        local_40 = Molecule::beginHBondAcceptor
                             (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
        while (local_40 != (Atom *)0x0) {
          StuntDouble::getPos(in_stack_fffffffffffffd48);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (Vector3<double> *)in_stack_fffffffffffffd38);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd48,
                            (Vector<double,_3U> *)
                            CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffd48,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          Snapshot::wrapVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          local_f0 = (pointer)Vector<double,_3U>::length((Vector<double,_3U> *)0x168b1c);
          if ((double)local_f0 <
              (double)in_RDI[0x9b].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) {
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd48,
                              (Vector<double,_3U> *)
                              CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffffd48,
                       (Vector<double,_3U> *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            Snapshot::wrapVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            local_100 = (pointer)Vector<double,_3U>::length((Vector<double,_3U> *)0x168b97);
            dVar5 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffd50,
                                   (Vector<double,_3U> *)in_stack_fffffffffffffd48);
            local_110 = (pointer)(dVar5 / ((double)local_f8 * (double)local_f0));
            dVar5 = acos((double)local_110);
            local_108 = (pointer)((dVar5 * 180.0) / 3.141592653589793);
            if (((double)local_108 <
                 (double)in_RDI[0x9b].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) &&
               ((double)local_100 <
                (double)in_RDI[0x9b].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)) {
              local_120 = StuntDouble::getGlobalIndex(&local_40->super_StuntDouble);
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)(in_RDI + 0x9a),(long)local_c);
              sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
              in_stack_fffffffffffffd40 = (value_type)sVar3;
              local_124 = in_stack_fffffffffffffd40;
              pvVar2 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)(in_RDI + 0x98),(long)local_c);
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_11c);
              *pvVar4 = in_stack_fffffffffffffd40;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x9a),(long)local_c);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                         (value_type_conflict2 *)in_stack_fffffffffffffd48);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x99),(long)local_c);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                         (value_type_conflict2 *)in_stack_fffffffffffffd48);
            }
          }
          local_40 = Molecule::nextHBondAcceptor
                               (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
        }
        local_30 = Molecule::nextHBondDonor
                             (in_stack_fffffffffffffd60,(iterator *)in_stack_fffffffffffffd58);
      }
      local_20 = SelectionManager::nextSelectedMolecule
                           (in_stack_fffffffffffffd50,(int *)in_stack_fffffffffffffd48);
    }
    local_18 = SelectionManager::nextSelectedMolecule
                         (in_stack_fffffffffffffd50,(int *)in_stack_fffffffffffffd48);
  }
  return;
}

Assistant:

void HBondPersistence::computeFrame(int istep) {
    Molecule* mol1;
    Molecule* mol2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    Vector3d HA;
    Vector3d uDA;
    RealType DAdist, DHdist, HAdist, theta, ctheta;
    int ii, jj;
    int hInd, aInd, index;

    // Map of atomic global IDs to donor atoms:
    GIDtoDonor_[istep].resize(info_->getNGlobalAtoms(), -1);

    if (!uniqueSelections_) { seleMan2_ = seleMan1_; }

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    if (uniqueSelections_ && evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
         mol1 = seleMan1_.nextSelectedMolecule(ii)) {
      for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
           mol2 = seleMan2_.nextSelectedMolecule(jj)) {
        // loop over the possible donors in molecule 1:
        for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol1->nextHBondDonor(hbdi)) {
          dPos = hbd->donorAtom->getPos();
          hPos = hbd->donatedHydrogen->getPos();
          DH   = hPos - dPos;
          currentSnapshot_->wrapVector(DH);
          DHdist = DH.length();

          hInd = hbd->donatedHydrogen->getGlobalIndex();
          aInd = -1;

          // loop over the possible acceptors in molecule 2:
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();
            DA   = aPos - dPos;
            currentSnapshot_->wrapVector(DA);
            DAdist = DA.length();

            // Distance criteria: are the donor and acceptor atoms
            // close enough?
            if (DAdist < OOCut_) {
              HA = aPos - hPos;
              currentSnapshot_->wrapVector(HA);
              HAdist = HA.length();

              ctheta = dot(DH, DA) / (DHdist * DAdist);
              theta  = acos(ctheta) * 180.0 / Constants::PI;

              // Angle criteria: are the D-H and D-A and vectors close?
              if (theta < thetaCut_ && HAdist < OHCut_) {
                // molecule 2 is a Hbond acceptor:
                aInd = hba->getGlobalIndex();

                index                    = acceptor_[istep].size();
                GIDtoDonor_[istep][hInd] = index;

                acceptor_[istep].push_back(aInd);
                DonorToGID_[istep].push_back(hInd);
              }
            }
          }
        }

        // loop over the possible donors in molecule 2:
        for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol2->nextHBondDonor(hbdi)) {
          dPos = hbd->donorAtom->getPos();
          hPos = hbd->donatedHydrogen->getPos();
          DH   = hPos - dPos;
          currentSnapshot_->wrapVector(DH);
          DHdist = DH.length();

          hInd = hbd->donatedHydrogen->getGlobalIndex();
          aInd = -1;

          // loop over the possible acceptors in molecule 1:
          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();
            DA   = aPos - dPos;
            currentSnapshot_->wrapVector(DA);
            DAdist = DA.length();

            // Distance criteria: are the donor and acceptor atoms
            // close enough?
            if (DAdist < OOCut_) {
              HA = aPos - hPos;
              currentSnapshot_->wrapVector(HA);
              HAdist = HA.length();

              ctheta = dot(DH, DA) / (DHdist * DAdist);
              theta  = acos(ctheta) * 180.0 / Constants::PI;

              // Angle criteria: are the D-H and D-A and vectors close?
              if (theta < thetaCut_ && HAdist < OHCut_) {
                // molecule 1 is a Hbond acceptor:
                aInd                     = hba->getGlobalIndex();
                index                    = acceptor_[istep].size();
                GIDtoDonor_[istep][hInd] = index;

                acceptor_[istep].push_back(aInd);
                DonorToGID_[istep].push_back(hInd);
              }
            }
          }
        }
      }
    }
  }